

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O3

CURLcode Curl_urldecode(Curl_easy *data,char *string,size_t length,char **ostring,size_t *olen,
                       _Bool reject_ctrl)

{
  byte *pbVar1;
  byte *pbVar2;
  size_t sVar3;
  byte bVar4;
  CURLcode CVar5;
  char *pcVar6;
  ushort **ppuVar7;
  ulong ulnum;
  size_t sVar8;
  char hexstr [3];
  char *ptr;
  byte local_4b;
  byte local_4a;
  undefined1 local_49;
  char **local_48;
  size_t *local_40;
  char *local_38;
  
  local_40 = olen;
  if (length == 0) {
    length = strlen(string);
  }
  pcVar6 = (char *)(*Curl_cmalloc)(length + 1);
  if (pcVar6 == (char *)0x0) {
    CVar5 = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar8 = 0;
    sVar3 = length + 1;
    local_48 = ostring;
    for (; length != 0; length = length - 1) {
      bVar4 = *string;
      if ((length < 3) || (bVar4 != 0x25)) {
LAB_00502227:
        if ((reject_ctrl) && (bVar4 < 0x20)) {
          (*Curl_cfree)(pcVar6);
          return CURLE_URL_MALFORMAT;
        }
      }
      else {
        ppuVar7 = __ctype_b_loc();
        pbVar1 = (byte *)string + 1;
        bVar4 = 0x25;
        if (((*(byte *)((long)*ppuVar7 + (ulong)*pbVar1 * 2 + 1) & 0x10) != 0) &&
           (pbVar2 = (byte *)string + 2,
           (*(byte *)((long)*ppuVar7 + (ulong)*pbVar2 * 2 + 1) & 0x10) != 0)) {
          string = (char *)((byte *)string + 2);
          local_49 = 0;
          local_4b = *pbVar1;
          local_4a = *pbVar2;
          ulnum = strtoul((char *)&local_4b,&local_38,0x10);
          bVar4 = curlx_ultouc(ulnum);
          length = sVar3 - 3;
          goto LAB_00502227;
        }
      }
      pcVar6[sVar8] = bVar4;
      sVar8 = sVar8 + 1;
      string = (char *)((byte *)string + 1);
      sVar3 = length;
    }
    pcVar6[sVar8] = '\0';
    if (local_40 != (size_t *)0x0) {
      *local_40 = sVar8;
    }
    *local_48 = pcVar6;
    CVar5 = CURLE_OK;
  }
  return CVar5;
}

Assistant:

CURLcode Curl_urldecode(struct Curl_easy *data,
                        const char *string, size_t length,
                        char **ostring, size_t *olen,
                        bool reject_ctrl)
{
  size_t alloc = (length?length:strlen(string))+1;
  char *ns = malloc(alloc);
  unsigned char in;
  size_t strindex=0;
  unsigned long hex;
  CURLcode result;

  if(!ns)
    return CURLE_OUT_OF_MEMORY;

  while(--alloc > 0) {
    in = *string;
    if(('%' == in) && (alloc > 2) &&
       ISXDIGIT(string[1]) && ISXDIGIT(string[2])) {
      /* this is two hexadecimal digits following a '%' */
      char hexstr[3];
      char *ptr;
      hexstr[0] = string[1];
      hexstr[1] = string[2];
      hexstr[2] = 0;

      hex = strtoul(hexstr, &ptr, 16);

      in = curlx_ultouc(hex); /* this long is never bigger than 255 anyway */

      result = Curl_convert_from_network(data, &in, 1);
      if(result) {
        /* Curl_convert_from_network calls failf if unsuccessful */
        free(ns);
        return result;
      }

      string+=2;
      alloc-=2;
    }

    if(reject_ctrl && (in < 0x20)) {
      free(ns);
      return CURLE_URL_MALFORMAT;
    }

    ns[strindex++] = in;
    string++;
  }
  ns[strindex]=0; /* terminate it */

  if(olen)
    /* store output size */
    *olen = strindex;

  /* store output string */
  *ostring = ns;

  return CURLE_OK;
}